

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

void tcp_listener_doclose(tcp_listener *l)

{
  nni_aio *aio_00;
  nni_aio *aio;
  tcp_listener *l_local;
  
  l->closed = true;
  while( true ) {
    aio_00 = (nni_aio *)nni_list_first(&l->acceptq);
    if (aio_00 == (nni_aio *)0x0) break;
    nni_aio_list_remove(aio_00);
    nni_aio_finish_error(aio_00,NNG_ECLOSED);
  }
  nni_posix_pfd_close(&l->pfd);
  return;
}

Assistant:

static void
tcp_listener_doclose(tcp_listener *l)
{
	nni_aio *aio;

	l->closed = true;
	while ((aio = nni_list_first(&l->acceptq)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	nni_posix_pfd_close(&l->pfd);
}